

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  Pgno PVar2;
  BtShared *pBVar3;
  MemPage *pMVar4;
  u8 *puVar5;
  uchar *puVar6;
  DbPage *pDbPage_00;
  int iVar7;
  Pgno *pPVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  u32 uVar12;
  long lVar13;
  BtCursor *pBVar14;
  Pgno nextPage;
  int local_60;
  uint local_5c;
  BtCursor *local_58;
  uchar *local_50;
  ulong local_48;
  BtShared *local_40;
  DbPage *pDbPage;
  
  pBVar3 = pCur->pBt;
  pMVar4 = pCur->pPage;
  local_60 = eOp;
  local_50 = pBuf;
  getCellInfo(pCur);
  puVar6 = local_50;
  puVar5 = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  uVar11 = (uint)uVar1;
  local_40 = pBVar3;
  if ((ulong)(pBVar3->usableSize - uVar11) < (ulong)((long)puVar5 - (long)pMVar4->aData)) {
    iVar7 = sqlite3CorruptError(0x10968);
    return iVar7;
  }
  local_58 = pCur;
  if (uVar11 < offset || uVar11 - offset == 0) {
    uVar11 = offset - uVar1;
    iVar7 = 0;
  }
  else {
    uVar12 = uVar11 - offset;
    if (amt + offset <= (uint)uVar1) {
      uVar12 = amt;
    }
    iVar7 = copyPayload(puVar5 + offset,local_50,uVar12,local_60,pMVar4->pDbPage);
    local_50 = puVar6 + (int)uVar12;
    amt = amt - uVar12;
    uVar11 = 0;
  }
  pBVar14 = local_58;
  if ((iVar7 != 0) || (amt == 0)) goto LAB_0014b058;
  uVar12 = local_40->usableSize;
  uVar10 = uVar12 - 4;
  local_48 = (ulong)(local_58->info).nLocal;
  nextPage = sqlite3Get4byte(puVar5 + local_48);
  local_5c = uVar10;
  if ((pBVar14->curFlags & 4) == 0) {
    pPVar8 = (Pgno *)0x0;
    uVar10 = (((pBVar14->info).nPayload + (uVar12 - (int)local_48)) - 5) / uVar10;
    if (pBVar14->aOverflow == (Pgno *)0x0) {
LAB_0014aedc:
      pPVar8 = (Pgno *)sqlite3Realloc(pPVar8,(long)(int)(uVar10 * 2) << 2);
      if (pPVar8 == (Pgno *)0x0) {
        return 7;
      }
      local_58->aOverflow = pPVar8;
    }
    else {
      iVar7 = (*sqlite3Config.m.xSize)(pBVar14->aOverflow);
      pPVar8 = pBVar14->aOverflow;
      if (iVar7 < (int)(uVar10 * 4)) goto LAB_0014aedc;
    }
    lVar13 = 0;
    memset(pPVar8,0,(long)(int)uVar10 << 2);
    local_58->curFlags = local_58->curFlags | 4;
  }
  else {
    lVar13 = 0;
    if (pBVar14->aOverflow[(ulong)uVar11 / (ulong)uVar10] != 0) {
      lVar13 = (long)(int)((ulong)uVar11 / (ulong)uVar10);
      nextPage = pBVar14->aOverflow[lVar13];
      uVar11 = uVar11 % uVar10;
    }
  }
  local_48 = CONCAT44(local_48._4_4_,(uint)(local_60 == 0) * 2);
  pBVar14 = local_58;
  uVar10 = local_5c;
  lVar13 = lVar13 * 4;
  do {
    if (nextPage == 0) {
      iVar7 = 0;
      break;
    }
    pPVar8 = pBVar14->aOverflow;
    *(Pgno *)((long)pPVar8 + lVar13) = nextPage;
    uVar9 = uVar11 - uVar10;
    if (uVar11 < uVar10) {
      uVar12 = uVar10 - uVar11;
      if (amt + uVar11 <= uVar10) {
        uVar12 = amt;
      }
      iVar7 = (*local_40->pPager->xGet)(local_40->pPager,nextPage,&pDbPage,(int)local_48);
      pDbPage_00 = pDbPage;
      if (iVar7 == 0) {
        puVar5 = (u8 *)pDbPage->pData;
        nextPage = sqlite3Get4byte(puVar5);
        puVar6 = local_50;
        iVar7 = copyPayload(puVar5 + (uVar11 + 4),local_50,uVar12,local_60,pDbPage_00);
        sqlite3PagerUnref(pDbPage);
        uVar11 = 0;
        local_50 = puVar6;
      }
      amt = amt - uVar12;
      if (amt == 0) {
        return iVar7;
      }
      local_50 = local_50 + (int)uVar12;
      pBVar14 = local_58;
      uVar10 = local_5c;
    }
    else {
      PVar2 = *(Pgno *)((long)pPVar8 + lVar13 + 4);
      uVar11 = uVar9;
      if (PVar2 == 0) {
        iVar7 = getOverflowPage(local_40,nextPage,(MemPage **)0x0,&nextPage);
        uVar10 = local_5c;
      }
      else {
        iVar7 = 0;
        nextPage = PVar2;
      }
    }
    lVar13 = lVar13 + 4;
  } while (iVar7 == 0);
LAB_0014b058:
  if ((iVar7 == 0) && (amt != 0)) {
    iVar7 = sqlite3CorruptError(0x109f9);
  }
  return iVar7;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->ix<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer 
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}